

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int StringReplace(SyBlob *pWorker,sxu32 nOfft,int nLen,char *zReplace,int nReplen)

{
  void *pvVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  sxu32 sVar7;
  
  uVar2 = pWorker->nByte;
  pvVar3 = (void *)(ulong)uVar2;
  if (nOfft + nLen < uVar2) {
    pvVar1 = pWorker->pBlob;
    uVar6 = (ulong)(nOfft + nLen);
    sVar7 = nOfft;
    do {
      *(undefined1 *)((long)pvVar1 + (ulong)sVar7) = *(undefined1 *)((long)pvVar1 + uVar6);
      sVar7 = sVar7 + 1;
      uVar6 = uVar6 + 1;
    } while ((uint)uVar6 < uVar2);
  }
  pWorker->nByte = pWorker->nByte - nLen;
  if (0 < nReplen) {
    uVar2 = SyBlobAppend(pWorker,(void *)0x0,nReplen);
    pvVar3 = (void *)(ulong)uVar2;
    if (uVar2 == 0) {
      pvVar3 = pWorker->pBlob;
      uVar2 = pWorker->nByte;
      uVar6 = (ulong)uVar2;
      if (uVar2 != nOfft) {
        iVar5 = nOfft - uVar2;
        do {
          iVar4 = (int)uVar6;
          uVar6 = (ulong)(iVar4 - 1);
          if (iVar4 == 0) {
            uVar6 = 0;
          }
          *(undefined1 *)((long)pvVar3 + (ulong)(uint)((int)uVar6 + nReplen)) =
               *(undefined1 *)((long)pvVar3 + uVar6);
          iVar5 = iVar5 + 1;
        } while (iVar5 != 0);
      }
      iVar5 = nReplen + 1;
      do {
        *(char *)((long)pvVar3 + (ulong)nOfft) = *zReplace;
        nOfft = nOfft + 1;
        zReplace = zReplace + 1;
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
      pWorker->nByte = pWorker->nByte + nReplen;
    }
  }
  return (int)pvVar3;
}

Assistant:

static int StringReplace(SyBlob *pWorker, sxu32 nOfft, int nLen, const char *zReplace, int nReplen)
{
	char *zInput = (char *)SyBlobData(pWorker);
	sxu32 n, m;
	n = SyBlobLength(pWorker);
	m = nOfft;
	/* Delete the old entry */
	STRDEL(zInput, n, m, nLen);
	SyBlobLength(pWorker) -= nLen;
	if( nReplen > 0 ){
		sxi32 iRep = nReplen;
		sxi32 rc;
		/*
		 * Make sure the working buffer is big enough to hold the replacement
		 * string.
		 */
		rc = SyBlobAppend(pWorker, 0/* Grow without an append operation*/, (sxu32)nReplen);
		if( rc != SXRET_OK ){
			/* Simply ignore any memory failure problem */
			return SXRET_OK;
		}
		/* Perform the insertion now */
		zInput = (char *)SyBlobData(pWorker);
		n = SyBlobLength(pWorker);
		SHIFTRANDINSERT(zInput, n, nOfft, zReplace, iRep);
		SyBlobLength(pWorker) += nReplen;
	}	
	return SXRET_OK;
}